

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double rlog1(double *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = *x;
  if ((-0.39 <= dVar3) && (dVar3 <= 0.57)) {
    if (-0.18 <= dVar3) {
      dVar1 = 0.0;
      if (0.18 < dVar3) {
        dVar3 = dVar3 * 0.75 + -0.25;
        dVar1 = dVar3 / 3.0 + 0.0456512608815524;
      }
    }
    else {
      dVar3 = (dVar3 + 0.3) / 0.7;
      dVar1 = 0.0566749439387324 - dVar3 * 0.3;
    }
    dVar3 = dVar3 / (dVar3 + 2.0);
    dVar2 = dVar3 * dVar3;
    return (1.0 / (1.0 - dVar3) -
           (((dVar2 * 0.00620886815375787 + -0.224696413112536) * dVar2 + 0.333333333333333) /
           ((dVar2 * 0.354508718369557 + -1.27408923933623) * dVar2 + 1.0)) * dVar3) *
           (dVar2 + dVar2) + dVar1;
  }
  dVar1 = log(dVar3 + 0.5 + 0.5);
  return dVar3 - dVar1;
}

Assistant:

double rlog1(double *x)
/*
-----------------------------------------------------------------------
             EVALUATION OF THE FUNCTION X - LN(1 + X)
-----------------------------------------------------------------------
*/
{
static double a = .566749439387324e-01;
static double b = .456512608815524e-01;
static double p0 = .333333333333333e+00;
static double p1 = -.224696413112536e+00;
static double p2 = .620886815375787e-02;
static double q1 = -.127408923933623e+01;
static double q2 = .354508718369557e+00;
static double rlog1,h,r,t,w,w1;
/*
     ..
     .. Executable Statements ..
*/
    if(*x < -0.39e0 || *x > 0.57e0) goto S40;
    if(*x < -0.18e0) goto S10;
    if(*x > 0.18e0) goto S20;
/*
              ARGUMENT REDUCTION
*/
    h = *x;
    w1 = 0.0e0;
    goto S30;
S10:
    h = *x+0.3e0;
    h /= 0.7e0;
    w1 = a-h*0.3e0;
    goto S30;
S20:
    h = 0.75e0**x-0.25e0;
    w1 = b+h/3.0e0;
S30:
/*
               SERIES EXPANSION
*/
    r = h/(h+2.0e0);
    t = r*r;
    w = ((p2*t+p1)*t+p0)/((q2*t+q1)*t+1.0e0);
    rlog1 = 2.0e0*t*(1.0e0/(1.0e0-r)-r*w)+w1;
    return rlog1;
S40:
    w = *x+0.5e0+0.5e0;
    rlog1 = *x-log(w);
    return rlog1;
}